

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O0

incoming_edges_range_t *
tchecker::ta::incoming_edges
          (incoming_edges_range_t *__return_storage_ptr__,system_t *system,const_vloc_sptr_t *vloc)

{
  system_t *system_00;
  array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  flat_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *intvars;
  end_iterator_t *in_RCX;
  flat_integer_variables_valuations_range_t local_4d8;
  incoming_edges_range_t local_480;
  undefined1 local_340 [8];
  incoming_edges_iterator_t it;
  const_vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  it._valuations_it._its.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vloc;
  system_00 = system_t::as_syncprod_system(system);
  syncprod::incoming_edges
            (&local_480,system_00,
             (const_vloc_sptr_t *)
             it._valuations_it._its.
             super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this = &tchecker::system::intvars_t::integer_variables
                    (&(system->super_system_t).super_system_t.super_intvars_t)->
          super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  intvars = array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::flattened(this);
  flat_integer_variables_valuations_range(&local_4d8,intvars);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_340,&local_480,&local_4d8);
  range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>
  ::~range_t(&local_4d8);
  range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>::~range_t
            (&local_480);
  make_range<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,tchecker::end_iterator_t>,tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>,tchecker::end_iterator_t>>,tchecker::end_iterator_t>
            (__return_storage_ptr__,(tchecker *)local_340,
             (edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)&past_the_end_iterator,in_RCX);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_340);
  return __return_storage_ptr__;
}

Assistant:

tchecker::ta::incoming_edges_range_t incoming_edges(tchecker::ta::system_t const & system,
                                                    tchecker::const_vloc_sptr_t const & vloc)
{
  tchecker::ta::incoming_edges_iterator_t it{
      tchecker::syncprod::incoming_edges(system.as_syncprod_system(), vloc),
      tchecker::flat_integer_variables_valuations_range(system.integer_variables().flattened())};
  return tchecker::make_range(it, tchecker::past_the_end_iterator);
}